

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

void Sfm_TimNodeRequired(Sfm_Tim_t *p,Abc_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Mio_Gate_t *pGate;
  Mio_PinPhase_t MVar5;
  Mio_Pin_t *pPin;
  int iVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  int *pTimesIn [6];
  long alStack_68 [7];
  
  uVar1 = pNode->Id;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 0) {
LAB_005328ab:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  iVar6 = (p->vTimReqs).nSize;
  if (iVar6 <= (int)(uVar1 * 2)) {
LAB_005328ca:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  iVar2 = (pNode->vFanins).nSize;
  if (6 < (long)iVar2) {
    __assert_fail("Abc_ObjFaninNum(pNode) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                  ,0x88,"void Sfm_TimNodeRequired(Sfm_Tim_t *, Abc_Obj_t *)");
  }
  piVar3 = (p->vTimReqs).pArray;
  if (0 < iVar2) {
    piVar4 = (pNode->vFanins).pArray;
    lVar7 = 0;
    do {
      uVar1 = piVar4[lVar7];
      if ((int)uVar1 < 0) goto LAB_005328ab;
      if (iVar6 <= (int)(uVar1 * 2)) goto LAB_005328ca;
      alStack_68[lVar7] = (long)(piVar3 + (ulong)uVar1 * 2);
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  pGate = (Mio_Gate_t *)(pNode->field_5).pData;
  pPin = Mio_GateReadPins(pGate);
  if (pPin == (Mio_Pin_t *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      piVar4 = (int *)alStack_68[lVar7];
      MVar5 = Mio_PinReadPhase(pPin);
      dVar9 = Mio_PinReadDelayBlockRise(pPin);
      dVar10 = Mio_PinReadDelayBlockFall(pPin);
      if (MVar5 == MIO_PHASE_INV) {
LAB_0053284d:
        iVar6 = piVar3[uVar8 * 2 + 1] - (int)((float)dVar9 * 1000.0);
        if (*piVar4 < iVar6) {
          iVar6 = *piVar4;
        }
        *piVar4 = iVar6;
        iVar6 = piVar3[uVar8 * 2] - (int)((float)dVar10 * 1000.0);
        if (piVar4[1] < iVar6) {
          iVar6 = piVar4[1];
        }
        piVar4[1] = iVar6;
      }
      else {
        iVar6 = piVar3[uVar8 * 2] - (int)((float)dVar9 * 1000.0);
        if (*piVar4 < iVar6) {
          iVar6 = *piVar4;
        }
        *piVar4 = iVar6;
        iVar6 = piVar3[uVar8 * 2 + 1] - (int)((float)dVar10 * 1000.0);
        if (piVar4[1] < iVar6) {
          iVar6 = piVar4[1];
        }
        piVar4[1] = iVar6;
        if (MVar5 != MIO_PHASE_NONINV) goto LAB_0053284d;
      }
      pPin = Mio_PinReadNext(pPin);
      lVar7 = lVar7 + 1;
    } while (pPin != (Mio_Pin_t *)0x0);
  }
  iVar6 = Mio_GateReadPinNum(pGate);
  if ((int)lVar7 != iVar6) {
    __assert_fail("i == Mio_GateReadPinNum(pGate)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                  ,0x82,"void Sfm_TimGateRequired(Sfm_Tim_t *, Mio_Gate_t *, int **, int *)");
  }
  return;
}

Assistant:

void Sfm_TimNodeRequired( Sfm_Tim_t * p, Abc_Obj_t * pNode )
{
    int i, iFanin, * pTimesIn[6];
    int * pTimeOut = Sfm_TimReq(p, pNode);
    assert( Abc_ObjFaninNum(pNode) <= 6 );
    Abc_ObjForEachFaninId( pNode, iFanin, i )
        pTimesIn[i] = Sfm_TimReqId( p, iFanin );
    Sfm_TimGateRequired( p, (Mio_Gate_t *)pNode->pData, pTimesIn, pTimeOut );
}